

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::SliceParameter::InternalSerializeWithCachedSizesToArray
          (SliceParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  LogMessage *other;
  Rep *pRVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    uVar5 = this->slice_dim_;
    *target = '\b';
    pbVar9 = target + 1;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar9 = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar3 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar3);
    }
    *pbVar9 = (byte)uVar6;
    target = pbVar9 + 1;
  }
  uVar5 = (this->slice_point_).current_size_;
  if (uVar5 != 0) {
    pRVar4 = (this->slice_point_).rep_;
    if (pRVar4 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_60,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
      pRVar4 = (this->slice_point_).rep_;
    }
    uVar7 = 1;
    if (1 < (int)uVar5) {
      uVar7 = (ulong)uVar5;
    }
    uVar8 = 0;
    do {
      uVar5 = pRVar4->elements[uVar8];
      *target = 0x10;
      pbVar9 = target + 1;
      uVar6 = uVar5;
      if (0x7f < uVar5) {
        do {
          *pbVar9 = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar3);
      }
      *pbVar9 = (byte)uVar6;
      target = pbVar9 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  if ((uVar1 & 2) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar9 = target + 1;
    *target = 0x18;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar9 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    *pbVar9 = (byte)uVar8;
    target = pbVar9 + 1;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SliceParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.SliceParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 slice_dim = 1 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->slice_dim(), target);
  }

  // repeated uint32 slice_point = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->slice_point_, target);

  // optional int32 axis = 3 [default = 1];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->axis(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.SliceParameter)
  return target;
}